

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O1

uint32_t IntegerLog2(uint64_t n)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  
  if (n == 0) {
    uVar3 = 1;
  }
  else {
    uVar3 = (uint)((n & n - 1) != 0);
  }
  lVar1 = 0x3f;
  if (n != 0) {
    for (; n >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar2 = (int)lVar1;
  if (n < 2) {
    iVar2 = 0;
  }
  return iVar2 + uVar3;
}

Assistant:

uint32_t IntegerLog2(uint64_t n) {
  // TODO: Add support for hardware instruction
  uint32_t l = ISPOWOF2(n) ? 0 : 1;
  while (n >>= 1)
    ++l;
  return l;
}